

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.c
# Opt level: O1

void solver_debug_check_trail(solver_t *s)

{
  uint uVar1;
  uint uVar2;
  vec_uint_t *pvVar3;
  vec_char_t *p;
  FILE *__stream;
  char cVar4;
  uint *__ptr;
  void *pvVar5;
  long lVar6;
  ulong uVar7;
  uint idx;
  ulong __nmemb;
  
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 0;
  __ptr[1] = 0;
  __ptr[2] = 0;
  __ptr[3] = 0;
  fprintf(_stdout,"[Satoko] Checking for trail(%u) inconsistencies...\n",(ulong)s->trail->size);
  if ((__ptr == (uint *)0x0) || (pvVar3 = s->trail, pvVar3 == (vec_uint_t *)0x0)) {
    __assert_fail("dest != NULL && src != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_uint.h"
                  ,0xa0,"void vec_uint_duplicate(vec_uint_t *, const vec_uint_t *)");
  }
  uVar1 = pvVar3->cap;
  __ptr[1] = uVar1;
  if (*__ptr < uVar1) {
    pvVar5 = realloc(*(void **)(__ptr + 2),(ulong)uVar1 * 4);
    *(void **)(__ptr + 2) = pvVar5;
    if (pvVar5 == (void *)0x0) {
      __assert_fail("p->data != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_uint.h"
                    ,0x5f,"void vec_uint_resize(vec_uint_t *, unsigned int)");
    }
    *__ptr = uVar1;
  }
  pvVar5 = *(void **)(__ptr + 2);
  memcpy(pvVar5,pvVar3->data,(ulong)pvVar3->cap << 2);
  uVar1 = pvVar3->size;
  __nmemb = (ulong)uVar1;
  __ptr[1] = uVar1;
  qsort(pvVar5,__nmemb,4,vec_uint_asc_compare);
  __stream = _stdout;
  if (1 < __nmemb) {
    lVar6 = 1;
    do {
      if ((*(uint *)((long)pvVar5 + lVar6 * 4) ^ *(uint *)((long)pvVar5 + lVar6 * 4 + -4)) == 1) {
        fprintf(_stdout,"[Satoko] Inconsistent trail: %u %u\n");
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/solver.c"
                      ,0x2c4,"void solver_debug_check_trail(solver_t *)");
      }
      lVar6 = lVar6 + 1;
    } while (uVar1 != (uint)lVar6);
  }
  if (__nmemb != 0) {
    p = s->assigns;
    lVar6 = 0;
    do {
      uVar2 = *(uint *)((long)pvVar5 + lVar6 * 4);
      idx = uVar2 >> 1;
      if (p->size <= idx) {
        __assert_fail("idx >= 0 && idx < p->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_char.h"
                      ,0x85,"char vec_char_at(vec_char_t *, unsigned int)");
      }
      if (p->data[idx] != ((byte)uVar2 & 1)) {
        cVar4 = vec_char_at(p,idx);
        fprintf(__stream,"[Satoko] Inconsistent trail assignment: %u, %u\n",(ulong)(uint)(int)cVar4,
                (ulong)*(uint *)((long)pvVar5 + lVar6 * 4));
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/solver.c"
                      ,0x2cb,"void solver_debug_check_trail(solver_t *)");
      }
      lVar6 = lVar6 + 1;
    } while (uVar1 != (uint)lVar6);
  }
  fwrite("[Satoko] Trail OK.\n",0x13,1,_stdout);
  fprintf(_stdout,"Vector has %u(%u) entries: {",(ulong)uVar1,(ulong)*__ptr);
  if (__nmemb != 0) {
    uVar7 = 0;
    do {
      fprintf(_stdout," %u",(ulong)*(uint *)((long)pvVar5 + uVar7 * 4));
      uVar7 = uVar7 + 1;
    } while (__nmemb != uVar7);
  }
  fwrite(" }\n",3,1,_stdout);
  if (pvVar5 != (void *)0x0) {
    free(pvVar5);
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  return;
}

Assistant:

void solver_debug_check_trail(solver_t *s)
{
    unsigned i;
    unsigned *array;
    vec_uint_t *trail_dup = vec_uint_alloc(0);
    fprintf(stdout, "[Satoko] Checking for trail(%u) inconsistencies...\n", vec_uint_size(s->trail));
    vec_uint_duplicate(trail_dup, s->trail);
    vec_uint_sort(trail_dup, 1);
    array = vec_uint_data(trail_dup);
    for (i = 1; i < vec_uint_size(trail_dup); i++) {
        if (array[i - 1] == lit_compl(array[i])) {
            fprintf(stdout, "[Satoko] Inconsistent trail: %u %u\n", array[i - 1], array[i]);
            assert(0);
            return;
        }
    }
    for (i = 0; i < vec_uint_size(trail_dup); i++) {
        if (var_value(s, lit2var(array[i])) != lit_polarity(array[i])) {
            fprintf(stdout, "[Satoko] Inconsistent trail assignment: %u, %u\n", vec_char_at(s->assigns, lit2var(array[i])), array[i]);
            assert(0);
            return;
        }
    }
    fprintf(stdout, "[Satoko] Trail OK.\n");
    vec_uint_print(trail_dup);
    vec_uint_free(trail_dup);

}